

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gost_crypt.c
# Opt level: O0

int gost_cipher_set_param(ossl_gost_cipher_ctx *c,int nid)

{
  gost_ctx *c_00;
  int in_ESI;
  u4 *in_RDI;
  gost_cipher_info *param;
  gost_subst_block *b;
  undefined4 in_stack_fffffffffffffff8;
  undefined4 in_stack_fffffffffffffffc;
  
  if (in_ESI == 0) {
    b = (gost_subst_block *)0x0;
  }
  else {
    b = (gost_subst_block *)OBJ_nid2obj(in_ESI);
  }
  c_00 = (gost_ctx *)
         get_encryption_params
                   ((ASN1_OBJECT *)CONCAT44(in_stack_fffffffffffffffc,in_stack_fffffffffffffff8));
  if (c_00 != (gost_ctx *)0x0) {
    *in_RDI = c_00->master_key[0];
    in_RDI[2] = c_00->master_key[4];
    in_RDI[1] = 0;
    gost_init(c_00,b);
  }
  return (uint)(c_00 != (gost_ctx *)0x0);
}

Assistant:

static int gost_cipher_set_param(struct ossl_gost_cipher_ctx *c, int nid)
{
    const struct gost_cipher_info *param;
    param = get_encryption_params((nid == NID_undef ? NULL : OBJ_nid2obj(nid)));
    if (!param)
        return 0;

    c->paramNID = param->nid;
    c->key_meshing = param->key_meshing;
    c->count = 0;
    gost_init(&(c->cctx), param->sblock);
    return 1;
}